

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O2

void anon_unknown.dwarf_1e32c8::ParseError(string *message,Token *token)

{
  DeadlyImportError *this;
  allocator local_61;
  string local_60;
  string local_40;
  
  this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_60,"FBX-Parser",&local_61);
  Assimp::FBX::Util::AddTokenText(&local_40,&local_60,message,token);
  DeadlyImportError::DeadlyImportError(this,&local_40);
  __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

AI_WONT_RETURN void ParseError(const std::string& message, const Token& token)
    {
        throw DeadlyImportError(Util::AddTokenText("FBX-Parser",message,&token));
    }